

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::chooseColumn(HEkkDual *this,HVector *row_ep)

{
  HEkkDualRow *this_00;
  HighsInt *pHVar1;
  int iVar2;
  HighsOptions *pHVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  char cVar7;
  HighsInt HVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  
  if (this->rebuild_reason == 0) {
    pHVar3 = this->ekk_instance_->options_;
    iVar11 = 0;
    HEkk::tableauRowPrice(this->ekk_instance_,false,row_ep,&this->row_ap,-2);
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2e,0);
    this_00 = &this->dualRow;
    HEkkDualRow::clear(this_00);
    (this->dualRow).workDelta = this->delta_primal;
    HEkkDualRow::createFreemove(this_00,row_ep);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2e,0);
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x30,0);
    HEkkDualRow::chooseMakepack(this_00,&this->row_ap,0);
    HEkkDualRow::chooseMakepack(this_00,row_ep,this->solver_num_col);
    dVar13 = HEkk::getValueScale(this->ekk_instance_,(this->dualRow).packCount,
                                 &(this->dualRow).packValue);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x30,0);
    do {
      HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x31,0);
      HEkkDualRow::choosePossible(this_00);
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x31,0);
      this->variable_in = -1;
      if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
        this->rebuild_reason = 6;
        return;
      }
      HVar8 = HEkkDualRow::chooseFinal(this_00);
      if (HVar8 == 0) {
        iVar2 = (this->dualRow).workPivot;
        if (iVar2 < 0) {
          cVar7 = '\x02';
        }
        else {
          if (ABS((this->dualRow).workAlpha * dVar13) <=
              (pHVar3->super_HighsOptionsStruct).dual_simplex_pivot_growth_tolerance) {
            if (iVar11 == 0) {
              pHVar1 = &(this->ekk_instance_->analysis_).num_improve_choose_column_row_call;
              *pHVar1 = *pHVar1 + 1;
              improveChooseColumnRow(this,row_ep);
            }
            else {
              pHVar1 = &(this->ekk_instance_->analysis_).num_remove_pivot_from_pack;
              *pHVar1 = *pHVar1 + 1;
              lVar10 = (long)(this->dualRow).packCount;
              if (0 < lVar10) {
                piVar4 = (this->dualRow).packIndex.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                lVar9 = 0;
                do {
                  if (piVar4[lVar9] == iVar2) {
                    piVar4[lVar9] = piVar4[lVar10 + -1];
                    iVar2 = (this->dualRow).packCount;
                    pdVar5 = (this->dualRow).packValue.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    pdVar5[lVar9] = pdVar5[(long)iVar2 + -1];
                    (this->dualRow).packCount = iVar2 + -1;
                    break;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar10 != lVar9);
              }
            }
            (this->dualRow).workPivot = -1;
          }
          bVar12 = (this->dualRow).workPivot < 0;
          bVar6 = 0 < (this->dualRow).packCount;
          iVar11 = iVar11 + (uint)(bVar6 && bVar12);
          cVar7 = (!bVar6 || !bVar12) * '\x02';
        }
      }
      else {
        this->rebuild_reason = 9;
        cVar7 = '\x01';
      }
    } while (cVar7 == '\0');
    if (cVar7 == '\x02') {
      HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3a,0);
      HEkkDualRow::deleteFreemove(this_00);
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3a,0);
      this->variable_in = (this->dualRow).workPivot;
      this->alpha_row = (this->dualRow).workAlpha;
      this->theta_dual = (this->dualRow).workTheta;
      if ((this->edge_weight_mode == kDevex) && (this->new_devex_framework == false)) {
        HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3b,0);
        HEkkDualRow::computeDevexWeight(this_00,-1);
        dVar13 = (this->dualRow).computed_edge_weight;
        if (dVar13 <= 1.0) {
          dVar13 = 1.0;
        }
        this->computed_edge_weight = dVar13;
        HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3b,0);
        return;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::chooseColumn(HVector* row_ep) {
  // Compute pivot row (PRICE) and choose the index of a column to enter the
  // basis (CHUZC)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  HighsOptions* options = ekk_instance_.options_;
  HighsLp& lp = ekk_instance_.lp_;

  HighsInt debug_price_report = kDebugReportOff;
  const bool debug_price_report_on = false;
  const bool debug_small_pivot_issue_report_on = false;
  bool debug_small_pivot_issue_report = false;
  bool debug_rows_report = false;
  if (ekk_instance_.debug_iteration_report_) {
    if (debug_price_report_on) debug_price_report = kDebugReportAll;
    debug_rows_report = debug_price_report_on;
    debug_small_pivot_issue_report = debug_small_pivot_issue_report_on;
    if (debug_price_report != kDebugReportOff || debug_rows_report ||
        debug_small_pivot_issue_report)
      printf("HEkkDual::chooseColumn Check iter = %d\n",
             (int)ekk_instance_.iteration_count_);
  }
  //
  // PRICE
  //
  const bool quad_precision = false;
  ekk_instance_.tableauRowPrice(quad_precision, *row_ep, row_ap,
                                debug_price_report);
  if (debug_rows_report) {
    ekk_instance_.simplex_nla_.reportArray("Row a_p", 0, &row_ap, true);
    ekk_instance_.simplex_nla_.reportArray("Row e_p", lp.num_col_, row_ep,
                                           true);
  }
  //
  // CHUZC
  //
  // Section 0: Clear data and call createFreemove to set a value of
  // nonbasicMove for all free columns to prevent their dual values
  // from being changed.
  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);
  //
  // Section 1: Pack row_ap and row_ep
  analysis->simplexTimerStart(Chuzc1Clock);
  // Pack row_ap into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(&row_ap, 0);
  // Pack row_ep into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(row_ep, solver_num_col);
  const double row_ep_scale =
      ekk_instance_.getValueScale(dualRow.packCount, dualRow.packValue);
  analysis->simplexTimerStop(Chuzc1Clock);
  // Loop until an acceptable pivot is found. Each pass either finds a
  // pivot, identifies possible unboundedness, or reduced the number
  // of nonzeros in dualRow.pack_value
  HighsInt chuzc_pass = 0;
  for (;;) {
    //
    // Section 2: Determine the possible variables - candidates for CHUZC
    analysis->simplexTimerStart(Chuzc2Clock);
    dualRow.choosePossible();
    analysis->simplexTimerStop(Chuzc2Clock);
    //
    // Take action if the step to an expanded bound is not positive, or
    // there are no candidates for CHUZC
    variable_in = -1;
    if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
      if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       "
            "Negative step or no candidates after %2d CHUZC passes\n",
            (int)chuzc_pass);
      }
      if (debug_rows_report) {
        ekk_instance_.simplex_nla_.reportVector(
            "dualRow.packValue/Index", dualRow.packCount, dualRow.packValue,
            dualRow.packIndex, true);
      }
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
      return;
    }
    //
    // Sections 3 and 4: Perform (bound-flipping) ratio test. This can
    // fail if the dual values are excessively large
    bool chooseColumnFail = (dualRow.chooseFinal() != 0);
    if (chooseColumnFail) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
    if (dualRow.workPivot >= 0) {
      const double growth_tolerance =
          options->dual_simplex_pivot_growth_tolerance;  // kHighsMacheps; //
      // A pivot has been chosen
      double alpha_row = dualRow.workAlpha;
      assert(alpha_row);
      const double scaled_value = row_ep_scale * alpha_row;
      if (std::abs(scaled_value) <= growth_tolerance) {
        if (chuzc_pass == 0 && debug_small_pivot_issue_report)
          printf(
              "CHUZC: Solve %6d; Iter %4d; ||e_p|| = %11.4g: Variable %6d "
              "Pivot %11.4g (dual "
              "%11.4g; ratio = %11.4g) is small",
              (int)ekk_instance_.debug_solve_call_num_,
              (int)ekk_instance_.iteration_count_, 1.0 / row_ep_scale,
              (int)dualRow.workPivot, dualRow.workAlpha,
              workDual[dualRow.workPivot],
              workDual[dualRow.workPivot] / dualRow.workAlpha);
        // On the first pass, try to make the pivotal row more accurate
        if (chuzc_pass == 0) {
          if (debug_small_pivot_issue_report) printf(": improve row\n");
          ekk_instance_.analysis_.num_improve_choose_column_row_call++;
          improveChooseColumnRow(row_ep);
        } else {
          // Remove the pivot
          ekk_instance_.analysis_.num_remove_pivot_from_pack++;
          for (HighsInt i = 0; i < dualRow.packCount; i++) {
            if (dualRow.packIndex[i] == dualRow.workPivot) {
              dualRow.packIndex[i] = dualRow.packIndex[dualRow.packCount - 1];
              dualRow.packValue[i] = dualRow.packValue[dualRow.packCount - 1];
              dualRow.packCount--;
              if (chuzc_pass == 0 && debug_small_pivot_issue_report)
                printf(": removing pivot gives pack count = %6d",
                       (int)dualRow.packCount);
              break;
            }
          }
          if (chuzc_pass == 0 && debug_small_pivot_issue_report)
            printf(" so %s\n", dualRow.packCount > 0 ? "repeat CHUZC"
                                                     : "consider unbounded");
        }
        // Indicate that no pivot has been chosen
        dualRow.workPivot = -1;
      } else if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       Variable "
            "%6d "
            "Pivot %11.4g (dual "
            "%11.4g; ratio = %11.4g) is OK after %2d CHUZC passes\n",
            (int)dualRow.workPivot, dualRow.workAlpha,
            workDual[dualRow.workPivot],
            workDual[dualRow.workPivot] / dualRow.workAlpha, (int)chuzc_pass);
      }
    } else {
      // No pivot has been chosen
      assert(dualRow.workPivot == -1);
      if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       No pivot "
            "after %2d CHUZC passes\n",
            (int)chuzc_pass);
      }
      break;
    }
    // If a pivot has been chosen, or there are no more packed values
    // then end CHUZC
    if (dualRow.workPivot >= 0 || dualRow.packCount <= 0) break;
    chuzc_pass++;
  }
  //
  // Section 5: Reset the nonbasicMove values for free columns
  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);
  // Record values for basis change, checking for numerical problems and update
  // of dual variables
  variable_in = dualRow.workPivot;  // Index of the column entering the basis
  alpha_row = dualRow.workAlpha;    // Pivot value computed row-wise - used for
                                    // numerical checking
  theta_dual = dualRow.workTheta;   // Dual step length

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the exact Devex weight
    dualRow.computeDevexWeight();
    computed_edge_weight = dualRow.computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
  return;
}